

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseTools.cpp
# Opt level: O3

char * tonk::ErrorTypeToString(ErrorType errorType)

{
  if (errorType < Count) {
    return (&PTR_anon_var_dwarf_11a25f_001cf468)[errorType];
  }
  return "Unknown";
}

Assistant:

const char* ErrorTypeToString(ErrorType errorType)
{
    static_assert((int)ErrorType::Count == 7, "Update this");
    switch (errorType)
    {
    case ErrorType::Tonk:    return "Tonk";
    case ErrorType::Siamese: return "Siamese";
    case ErrorType::Asio:    return "Asio";
    case ErrorType::LastErr: return "LastErr";
    case ErrorType::Cymric:  return "Cymric";
    case ErrorType::Encrypt: return "Encrypt";
    case ErrorType::Zstd:    return "Zstd";
    default: break;
    }
    return "Unknown";
}